

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

bool __thiscall smf::MidiFile::readBase64(MidiFile *this,string *base64data)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  MidiFile *this_00;
  stringstream stream;
  string sStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  this_00 = (MidiFile *)base64data;
  std::__cxx11::stringstream::stringstream(local_198);
  base64Decode(&sStack_1b8,this_00,base64data);
  std::operator<<(local_188,(string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  sVar1 = read(this,(int)local_198,__buf,in_RCX);
  std::__cxx11::stringstream::~stringstream(local_198);
  return (bool)(char)sVar1;
}

Assistant:

bool MidiFile::readBase64(const std::string& base64data) {
	std::stringstream stream;
	stream << MidiFile::base64Decode(base64data);
	return MidiFile::read(stream);
}